

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Bmcs_ManAddCnf(Bmcs_Man_t *p,satoko_t *pSat,Cnf_Dat_t *pCnf)

{
  int iVar1;
  int local_24;
  int i;
  Cnf_Dat_t *pCnf_local;
  satoko_t *pSat_local;
  Bmcs_Man_t *p_local;
  
  for (local_24 = p->nSatVarsOld; local_24 < p->nSatVars; local_24 = local_24 + 1) {
    satoko_add_variable(pSat,'\0');
  }
  local_24 = 0;
  while( true ) {
    if (pCnf->nClauses <= local_24) {
      return;
    }
    iVar1 = satoko_add_clause(pSat,pCnf->pClauses[local_24],
                              (int)((long)pCnf->pClauses[local_24 + 1] -
                                    (long)pCnf->pClauses[local_24] >> 2));
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                ,0x27b,"void Bmcs_ManAddCnf(Bmcs_Man_t *, satoko_t *, Cnf_Dat_t *)");
}

Assistant:

void Bmcs_ManAddCnf( Bmcs_Man_t * p, bmc_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i;
    for ( i = p->nSatVarsOld; i < p->nSatVars; i++ )
        bmc_sat_solver_addvar( pSat );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmc_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
}